

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O0

vector<Employee,_std::allocator<Employee>_> *
filter<std::vector<Employee,std::allocator<Employee>>,main::__1>
          (vector<Employee,_std::allocator<Employee>_> *__return_storage_ptr__,pointer container)

{
  pointer this;
  bool bVar1;
  reference e;
  Employee *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Employee,_std::allocator<Employee>_> *__range1;
  vector<Employee,_std::allocator<Employee>_> c;
  vector<Employee,_std::allocator<Employee>_> *container_local;
  vector<Employee,_std::allocator<Employee>_> *local_10;
  
  c.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = container;
  local_10 = __return_storage_ptr__;
  memset(&__range1,0,0x18);
  std::vector<Employee,_std::allocator<Employee>_>::vector
            ((vector<Employee,_std::allocator<Employee>_> *)&__range1);
  this = c.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  __end0 = std::vector<Employee,_std::allocator<Employee>_>::begin
                     ((vector<Employee,_std::allocator<Employee>_> *)
                      c.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  item = (Employee *)
         std::vector<Employee,_std::allocator<Employee>_>::end
                   ((vector<Employee,_std::allocator<Employee>_> *)this);
  while (bVar1 = __gnu_cxx::
                 operator==<const_Employee_*,_std::vector<Employee,_std::allocator<Employee>_>_>
                           (&__end0,(__normal_iterator<const_Employee_*,_std::vector<Employee,_std::allocator<Employee>_>_>
                                     *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
    e = __gnu_cxx::
        __normal_iterator<const_Employee_*,_std::vector<Employee,_std::allocator<Employee>_>_>::
        operator*(&__end0);
    bVar1 = main::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&container_local + 7),e);
    if (bVar1) {
      std::vector<Employee,_std::allocator<Employee>_>::push_back
                ((vector<Employee,_std::allocator<Employee>_> *)&__range1,e);
    }
    __gnu_cxx::
    __normal_iterator<const_Employee_*,_std::vector<Employee,_std::allocator<Employee>_>_>::
    operator++(&__end0);
  }
  std::vector<Employee,_std::allocator<Employee>_>::vector
            (__return_storage_ptr__,(vector<Employee,_std::allocator<Employee>_> *)&__range1);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

auto filter(const Container& container, Func func)
{
    auto c = Container();
    for(const auto& item : container)
        if(func(item))
            c.push_back(item);
    return c;
}